

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::~TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,void **vtt)

{
  void *pvVar1;
  TPZCompEl *this_00;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  TPZGeoEl *pTVar5;
  long lVar6;
  TPZConnect *pTVar7;
  TPZGeoEl *pTVar8;
  long *plVar9;
  int64_t iVar10;
  TPZGeoElSide gelside;
  TPZCompElSide largecel;
  TPZStack<TPZCompElSide,_10> celstack;
  TPZGeoElSide local_118;
  undefined1 local_100 [16];
  TPZStack<TPZCompElSide,_10> local_f0;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)((long)(this->fSideOrient).fExtAlloc + *(long *)((long)pvVar1 + -0x60) + -0x68) = vtt[9]
  ;
  pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
  if ((pTVar5 == (TPZGeoEl *)0x0) ||
     ((TPZCompElHDiv<pzshape::TPZShapeLinear> *)pTVar5->fReference == this)) {
    iVar2 = pztopology::TPZLine::SideDimension(2);
    if (iVar2 == 0) {
      local_118.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
           local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
      local_118.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
      local_118.fSide = 2;
      lVar6 = 0x28;
      do {
        *(undefined8 *)(local_100 + lVar6 + 8) = 0;
        *(undefined4 *)
         ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                  (local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
                 super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar6) = 0xffffffff;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 200);
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0;
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
           (_func_int **)&PTR__TPZManVector_0181a690;
      TPZGeoElSide::LowerLevelCompElementList2((TPZGeoElSide *)local_100,(int)&local_118);
      if ((_func_int **)local_100._0_8_ != (_func_int **)0x0) {
        uVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0x250))(this,0,2);
        pTVar7 = (TPZConnect *)
                 (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                        super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                        super_TPZCompEl + 0xa8))(this,uVar3);
        TPZConnect::RemoveDepend(pTVar7);
      }
      if (local_118.fGeoEl != (TPZGeoEl *)0x0) {
        TPZGeoElSide::HigherLevelCompElementList3(&local_118,&local_f0,0,1);
      }
      if (0 < local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements)
      {
        lVar6 = 8;
        iVar10 = local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                 fNElements;
        do {
          this_00 = *(TPZCompEl **)
                     ((long)local_f0.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fStore + lVar6 + -8);
          uVar3 = *(undefined4 *)
                   ((long)&(local_f0.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar6);
          pTVar8 = TPZCompEl::Reference(this_00);
          iVar2 = (**(code **)(*(long *)pTVar8 + 0x208))(pTVar8,uVar3);
          iVar4 = (**(code **)(*(long *)pTVar5 + 0x210))(pTVar5);
          if (iVar2 == iVar4 + -1) {
            plVar9 = (long *)__dynamic_cast(this_00,&TPZCompEl::typeinfo,
                                            &TPZInterpolatedElement::typeinfo,0);
            if (plVar9 == (long *)0x0) {
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                         ,0xc0);
            }
            uVar3 = (**(code **)(*plVar9 + 0x250))(plVar9,0,uVar3);
            pTVar7 = (TPZConnect *)(**(code **)(*plVar9 + 0xa8))(plVar9,uVar3);
            TPZConnect::RemoveDepend(pTVar7);
          }
          lVar6 = lVar6 + 0x10;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
          local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
             (_func_int **)&PTR__TPZVec_018142b0;
        if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
            (TPZCompElSide *)0x0) {
          operator_delete__(local_f0.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fStore);
        }
      }
    }
    if (pTVar5 != (TPZGeoEl *)0x0) {
      pTVar5->fReference = (TPZCompEl *)0x0;
    }
  }
  TPZManVector<long,_3>::~TPZManVector(&this->fConnectIndexes);
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&(this->fRestraints).
              super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>);
  TPZManVector<int,_2>::~TPZManVector(&this->fSideOrient);
  TPZInterpolatedElement::~TPZInterpolatedElement((TPZInterpolatedElement *)this,vtt + 2);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::~TPZCompElHDiv(){
    TPZGeoEl *gel = this->Reference();
    if (gel && gel->Reference() != this) {
        return;
    }
    for (int side=TSHAPE::NCornerNodes; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension-1) {
            continue;
        }
        TPZGeoElSide gelside(this->Reference(),side);
        TPZStack<TPZCompElSide> celstack;
        TPZCompElSide largecel = gelside.LowerLevelCompElementList2(0);
        if (largecel) {
            int cindex = SideConnectLocId(0, side);
            TPZConnect &c = this->Connect(cindex);
            c.RemoveDepend();
        }
        if (gelside.Element()){
            gelside.HigherLevelCompElementList3(celstack, 0, 1);
        }
        int64_t ncel = celstack.size();
        for (int64_t el=0; el<ncel; el++) {
            TPZCompElSide celside = celstack[el];
            TPZCompEl *celsmall = celside.Element();
            TPZGeoEl *gelsmall = celsmall->Reference();
            if (gelsmall->SideDimension(celside.Side()) != gel->Dimension()-1) {
                continue;
            }
            TPZInterpolatedElement *intelsmall = dynamic_cast<TPZInterpolatedElement *>(celsmall);
            if (!intelsmall) {
                DebugStop();
            }
            int cindex = intelsmall->SideConnectLocId(0, celside.Side());
            TPZConnect &c = intelsmall->Connect(cindex);
            c.RemoveDepend();
        }
    }
    if (gel){
        gel->ResetReference();
    }
}